

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

return_type_conflict * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>>::
and_then<____C_A_T_C_H____T_E_S_T____28()::__24&>
          (return_type_conflict *__return_storage_ptr__,void *this,anon_class_1_0_00000001 *fn)

{
  uint *puVar1;
  return_type_conflict *prVar2;
  
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->super_strong_type_base<std::variant<int,_int>,_true>).
               super_strong_type_payload<std::variant<int,_int>,_true>._value.
               super__Variant_base<int,_int>.super__Move_assign_alias<int,_int>.
               super__Copy_assign_alias<int,_int>.super__Move_ctor_alias<int,_int> + 4) == '\0') {
    puVar1 = (uint *)std::get<0ul,int,int>((variant<int,_int> *)__return_storage_ptr__);
    prVar2 = (return_type_conflict *)(ulong)(uint)((int)*puVar1 >> 1);
    if ((*puVar1 & 1) != 0) {
      prVar2 = (return_type_conflict *)0x100000064;
    }
  }
  else {
    puVar1 = (uint *)std::get<1ul,int,int>((variant<int,_int> *)__return_storage_ptr__);
    prVar2 = (return_type_conflict *)((ulong)*puVar1 | 0x100000000);
  }
  return prVar2;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }